

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
vkt::shaderexecutor::Functions::Sub::doApply
          (Interval *__return_storage_ptr__,Sub *this,EvalContext *ctx,IArgs *iargs)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ScopedRoundingMode diff_ctx_;
  Interval local_38;
  
  bVar1 = tcu::Interval::isOrdinary(iargs->a);
  if ((bVar1) && (bVar1 = tcu::Interval::isOrdinary(iargs->b), bVar1)) {
    diff_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar5 = iargs->a->m_lo;
    dVar2 = iargs->b->m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar5 = dVar5 - dVar2;
    local_38.m_hasNaN = NAN(dVar5);
    dVar2 = -INFINITY;
    if (!local_38.m_hasNaN) {
      dVar2 = dVar5;
    }
    dVar3 = INFINITY;
    if (!local_38.m_hasNaN) {
      dVar3 = dVar5;
    }
    dVar6 = iargs->a->m_hi - iargs->b->m_lo;
    dVar5 = -INFINITY;
    dVar4 = INFINITY;
    if (!NAN(dVar6)) {
      dVar5 = dVar6;
      dVar4 = dVar6;
    }
    local_38.m_hasNaN = local_38.m_hasNaN || NAN(dVar6);
    local_38.m_lo =
         (double)(~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4 | (ulong)dVar3 & -(ulong)(dVar3 <= dVar4)
                 );
    local_38.m_hi =
         (double)(~-(ulong)(dVar5 <= dVar2) & (ulong)dVar5 | (ulong)dVar2 & -(ulong)(dVar5 <= dVar2)
                 );
    tcu::ScopedRoundingMode::~ScopedRoundingMode(&diff_ctx_);
    tcu::FloatFormat::roundOut((Interval *)&diff_ctx_,&ctx->format,&local_38,true);
    tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,(Interval *)&diff_ctx_);
    return __return_storage_ptr__;
  }
  FloatFunc2::applyMonotone(__return_storage_ptr__,(FloatFunc2 *)this,ctx,iargs->a,iargs->b);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply		(const EvalContext&	ctx, const IArgs& iargs) const
	{
		// Fast-path for common case
		if (iargs.a.isOrdinary() && iargs.b.isOrdinary())
		{
			Interval ret;

			TCU_SET_INTERVAL_BOUNDS(ret, diff,
									diff = iargs.a.lo() - iargs.b.hi(),
									diff = iargs.a.hi() - iargs.b.lo());
			return ctx.format.convert(ctx.format.roundOut(ret, true));

		}
		else
		{
			return this->applyMonotone(ctx, iargs.a, iargs.b);
		}
	}